

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O3

int s3parse_comp_quest(pset_t *pset,uint32 n_pset,comp_quest_t *q,char *in_str)

{
  ushort **ppuVar1;
  quest_t **ppqVar2;
  uint32 *puVar3;
  byte bVar4;
  long ln;
  uint uVar5;
  char *pcVar6;
  byte *in_str_00;
  byte bVar7;
  ulong uVar8;
  
  bVar7 = *in_str;
  if (bVar7 != 0) {
    ppuVar1 = __ctype_b_loc();
    in_str_00 = (byte *)(in_str + 1);
    bVar4 = bVar7;
    do {
      if ((*(byte *)((long)*ppuVar1 + (ulong)bVar4 * 2 + 1) & 0x20) == 0) {
        pcVar6 = in_str;
        if (bVar4 == 0x28) goto LAB_0011fa7a;
        pcVar6 = "Composite question does not begin with \'(\' : %s\n";
        ln = 0x10e;
        goto LAB_0011fb64;
      }
      bVar4 = *in_str_00;
      in_str_00 = in_str_00 + 1;
    } while (bVar4 != 0);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
          ,0x107,"Empty string seen for composite question\n");
  return -1;
  while( true ) {
    bVar7 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    if (bVar7 == 0) break;
LAB_0011fa7a:
    if ((*(byte *)((long)*ppuVar1 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) break;
  }
  uVar8 = 0;
  uVar5 = 0;
  if (pcVar6[1] != '\0') {
    uVar5 = 0;
    do {
      pcVar6 = strchr(pcVar6 + 1,0x28);
      if (pcVar6 == (char *)0x0) break;
      uVar5 = uVar5 + 1;
    } while (pcVar6[1] != '\0');
  }
  q->sum_len = uVar5;
  ppqVar2 = (quest_t **)
            __ckd_calloc__((ulong)uVar5,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                           ,0x114);
  q->conj_q = ppqVar2;
  puVar3 = (uint32 *)
           __ckd_calloc__((ulong)q->sum_len,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
                          ,0x115);
  q->prod_len = puVar3;
  while( true ) {
    in_str_00 = (byte *)s3parse_conj(pset,n_pset,q->conj_q + uVar8,q->prod_len + uVar8,
                                     (char *)in_str_00);
    if (in_str_00 == (byte *)0x0) break;
    uVar8 = (ulong)((int)uVar8 + 1);
    if (*in_str_00 != 0x28) {
      return 0;
    }
  }
  pcVar6 = "Error while parsing %s\n";
  ln = 0x124;
LAB_0011fb64:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/quest.c"
          ,ln,pcVar6,in_str);
  return -1;
}

Assistant:

int
s3parse_comp_quest(pset_t *pset,
		   uint32 n_pset,
		   comp_quest_t *q,
		   char *in_str)
{
    char *s;
    uint32 i;

    s = in_str;

    for (; *s != '\0' && isspace((unsigned char)*s); s++);

    if (*s == '\0') {
	E_ERROR("Empty string seen for composite question\n");

	return S3_ERROR;
    }

    if (*s != '(') {
	E_ERROR("Composite question does not begin with '(' : %s\n",
		in_str);
	
	return S3_ERROR;
    }
	
    q->sum_len  = s3cnt_q_term(in_str);
    q->conj_q   = (quest_t **)ckd_calloc(q->sum_len, sizeof(quest_t *));
    q->prod_len = (uint32 *)ckd_calloc(q->sum_len, sizeof(uint32));

    ++s;	/* skip the open paren */

    i = 0;
    do {
	s = s3parse_conj(pset,
			 n_pset,
			 &q->conj_q[i],
			 &q->prod_len[i],
			 s);
	++i;
    } while (s && *s && *s == '(');

    if (s == NULL) {
	E_ERROR("Error while parsing %s\n", in_str);

	return S3_ERROR;
    }

    return S3_SUCCESS;
}